

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clownlzss.c
# Opt level: O1

int ClownLZSS_FindOptimalMatches
              (int filler_value,size_t maximum_match_length,size_t maximum_match_distance,
              _func_void_uchar_ptr_size_t_size_t_ClownLZSS_GraphEdge_ptr_void_ptr
              *extra_matches_callback,size_t literal_cost,
              _func_size_t_size_t_size_t_void_ptr *match_cost_callback,uchar *data,
              size_t bytes_per_value,size_t total_values,ClownLZSS_Match **_matches,
              size_t *_total_matches,void *user)

{
  ulong uVar1;
  ClownLZSS_Match *pCVar2;
  byte bVar3;
  ClownLZSS_Match *pCVar4;
  ClownLZSS_Match *pCVar5;
  ulong uVar6;
  ulong uVar7;
  size_t *psVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  size_t sVar13;
  uchar *puVar14;
  uchar *puVar15;
  uchar *puVar16;
  uchar *puVar17;
  uchar *puVar18;
  uchar *puVar19;
  ulong uVar20;
  size_t sVar21;
  size_t sVar22;
  size_t sVar23;
  
  sVar9 = 0;
  if (total_values == 0) {
    pCVar4 = (ClownLZSS_Match *)0x0;
  }
  else {
    pCVar4 = (ClownLZSS_Match *)malloc(maximum_match_distance * 0x10 + total_values * 0x18 + 0x818);
    if (pCVar4 == (ClownLZSS_Match *)0x0) {
      return 0;
    }
    pCVar2 = pCVar4 + total_values + 1;
    memset((anon_union_8_2_f60ed377_for_u *)&pCVar2->source + maximum_match_distance * 2,0xff,0x800)
    ;
    if (filler_value == -1) {
      if (maximum_match_distance != 0) {
        memset(pCVar2,0xff,maximum_match_distance * 8);
      }
    }
    else {
      sVar9 = maximum_match_distance - 1;
      ((anon_union_8_2_f60ed377_for_u *)&pCVar2->source)
      [maximum_match_distance + (long)filler_value + maximum_match_distance].cost = sVar9;
      ((anon_union_8_2_f60ed377_for_u *)&pCVar2->source)[maximum_match_distance].cost =
           0xffffffffffffffff;
      *(size_t *)((long)pCVar2 + maximum_match_distance * 8 + -8) =
           (long)filler_value + maximum_match_distance;
      if (sVar9 != 0) {
        sVar23 = 0;
        do {
          sVar13 = sVar23 + 1;
          (&pCVar2->destination)[maximum_match_distance + sVar23] = sVar23;
          ((anon_union_8_2_f60ed377_for_u *)&pCVar2->source)[sVar23].cost = sVar13;
          sVar23 = sVar13;
        } while (sVar13 != sVar9);
      }
    }
    ((anon_union_8_2_f60ed377_for_u *)&pCVar4->source)->cost = 0;
    sVar9 = total_values;
    pCVar5 = pCVar4;
    if (1 < total_values + 1) {
      do {
        ((anon_union_8_2_f60ed377_for_u *)&pCVar5[1].source)->cost = 0xffffffffffffffff;
        sVar9 = sVar9 - 1;
        pCVar5 = pCVar5 + 1;
      } while (sVar9 != 0);
    }
    uVar6 = (ulong)(bytes_per_value == 1);
    uVar20 = 0;
    do {
      bVar3 = data[uVar20 * bytes_per_value];
      uVar11 = uVar20 % maximum_match_distance;
      if (extra_matches_callback !=
          (_func_void_uchar_ptr_size_t_size_t_ClownLZSS_GraphEdge_ptr_void_ptr *)0x0) {
        (*extra_matches_callback)(data,total_values,uVar20,(ClownLZSS_GraphEdge *)pCVar4,user);
      }
      sVar23 = bVar3 + maximum_match_distance;
      sVar9 = ((anon_union_8_2_f60ed377_for_u *)&pCVar2->source)[maximum_match_distance + sVar23].
              cost;
      if (sVar9 != 0xffffffffffffffff) {
        uVar10 = total_values - uVar20;
        if (maximum_match_length <= total_values - uVar20) {
          uVar10 = maximum_match_length;
        }
        pCVar5 = pCVar4 + uVar20;
        do {
          uVar12 = (~sVar9 + uVar20 + maximum_match_distance) % maximum_match_distance;
          if (uVar6 < uVar10) {
            sVar13 = uVar12 + 1;
            puVar18 = data + (uVar6 + uVar20) * bytes_per_value + ~uVar12 * bytes_per_value;
            puVar17 = data + (uVar6 + uVar20) * bytes_per_value;
            uVar12 = uVar6;
            do {
              if (puVar18 < data) {
                if (bytes_per_value == 0) {
                  puVar16 = puVar17;
                  sVar22 = 0;
                }
                else {
                  sVar21 = 0;
                  puVar14 = puVar17;
                  do {
                    puVar16 = puVar14 + 1;
                    sVar22 = sVar21;
                    if (*puVar14 != (uchar)filler_value) break;
                    sVar21 = sVar21 + 1;
                    puVar16 = puVar17 + bytes_per_value;
                    sVar22 = bytes_per_value;
                    puVar14 = puVar14 + 1;
                  } while (bytes_per_value != sVar21);
                }
                puVar17 = puVar16;
                puVar18 = puVar18 + bytes_per_value;
              }
              else if (bytes_per_value == 0) {
                sVar22 = 0;
              }
              else {
                puVar16 = puVar17 + bytes_per_value;
                puVar14 = puVar18 + bytes_per_value;
                sVar21 = 0;
                puVar15 = puVar17;
                puVar19 = puVar18;
                do {
                  puVar17 = puVar15 + 1;
                  puVar18 = puVar19 + 1;
                  sVar22 = sVar21;
                  if (*puVar15 != *puVar19) break;
                  sVar21 = sVar21 + 1;
                  puVar17 = puVar16;
                  puVar18 = puVar14;
                  sVar22 = bytes_per_value;
                  puVar15 = puVar15 + 1;
                  puVar19 = puVar19 + 1;
                } while (bytes_per_value != sVar21);
              }
              if (sVar22 != bytes_per_value) break;
              uVar1 = uVar12 + 1;
              sVar21 = (*match_cost_callback)(sVar13,uVar1,user);
              if ((sVar21 != 0) &&
                 (uVar7 = sVar21 + ((anon_union_8_2_f60ed377_for_u *)&pCVar5->source)->cost,
                 uVar7 < ((anon_union_8_2_f60ed377_for_u *)&pCVar5[uVar12 + 1].source)->cost)) {
                ((anon_union_8_2_f60ed377_for_u *)&pCVar5[uVar12 + 1].source)->cost = uVar7;
                pCVar5[uVar12 + 1].destination = uVar20;
                pCVar5[uVar12 + 1].length = uVar20 - sVar13;
              }
              if ((sVar22 != bytes_per_value) || (uVar12 = uVar1, uVar10 <= uVar1)) break;
            } while( true );
          }
          sVar9 = ((anon_union_8_2_f60ed377_for_u *)&pCVar2->source)[maximum_match_distance + sVar9]
                  .cost;
        } while (sVar9 != 0xffffffffffffffff);
      }
      sVar9 = uVar20 + 1;
      uVar10 = ((anon_union_8_2_f60ed377_for_u *)&pCVar4[uVar20].source)->cost + literal_cost;
      if (uVar10 <= ((anon_union_8_2_f60ed377_for_u *)&pCVar4[uVar20 + 1].source)->cost) {
        ((anon_union_8_2_f60ed377_for_u *)&pCVar4[uVar20 + 1].source)->cost = uVar10;
        pCVar4[uVar20 + 1].destination = uVar20;
        pCVar4[uVar20 + 1].length = sVar9;
      }
      if (((anon_union_8_2_f60ed377_for_u *)&pCVar2->source)[uVar11].cost != 0xffffffffffffffff) {
        ((anon_union_8_2_f60ed377_for_u *)&pCVar2->source)
        [maximum_match_distance + ((anon_union_8_2_f60ed377_for_u *)&pCVar2->source)[uVar11].cost].
        cost = 0xffffffffffffffff;
      }
      ((anon_union_8_2_f60ed377_for_u *)&pCVar2->source)[uVar11].cost = sVar23;
      sVar13 = ((anon_union_8_2_f60ed377_for_u *)&pCVar2->source)[maximum_match_distance + sVar23].
               cost;
      ((anon_union_8_2_f60ed377_for_u *)&pCVar2->source)[maximum_match_distance + uVar11].cost =
           sVar13;
      if (sVar13 != 0xffffffffffffffff) {
        ((anon_union_8_2_f60ed377_for_u *)&pCVar2->source)[sVar13].cost = uVar11;
      }
      ((anon_union_8_2_f60ed377_for_u *)&pCVar2->source)[maximum_match_distance + sVar23].cost =
           uVar11;
      uVar20 = sVar9;
    } while (sVar9 != total_values + (total_values == 0));
    pCVar4->destination = 0xffffffffffffffff;
    ((anon_union_8_2_f60ed377_for_u *)&pCVar4[total_values].source)->cost = 0xffffffffffffffff;
    sVar9 = pCVar4[total_values].destination;
    while (sVar23 = sVar9, sVar23 != 0xffffffffffffffff) {
      ((anon_union_8_2_f60ed377_for_u *)&pCVar4[sVar23].source)->cost = total_values;
      total_values = sVar23;
      sVar9 = pCVar4[sVar23].destination;
    }
    if (((anon_union_8_2_f60ed377_for_u *)&pCVar4->source)->cost == 0xffffffffffffffff) {
      sVar9 = 0;
    }
    else {
      psVar8 = &pCVar4->length;
      sVar9 = 0;
      sVar23 = 0;
      sVar13 = ((anon_union_8_2_f60ed377_for_u *)&pCVar4->source)->cost;
      do {
        ((ClownLZSS_GraphEdge *)(psVar8 + -2))->u =
             (anon_union_8_2_f60ed377_for_u)pCVar4[sVar13].length;
        psVar8[-1] = sVar23;
        *psVar8 = sVar13 - sVar23;
        sVar9 = sVar9 + 1;
        pCVar2 = pCVar4 + sVar13;
        psVar8 = psVar8 + 3;
        sVar23 = sVar13;
        sVar13 = ((anon_union_8_2_f60ed377_for_u *)&pCVar2->source)->cost;
      } while (((anon_union_8_2_f60ed377_for_u *)&pCVar2->source)->cost != 0xffffffffffffffff);
    }
  }
  *_matches = pCVar4;
  *_total_matches = sVar9;
  return 1;
}

Assistant:

int ClownLZSS_FindOptimalMatches(
	const int filler_value,
	const size_t maximum_match_length,
	const size_t maximum_match_distance,
	void (* const extra_matches_callback)(const unsigned char *data, size_t total_values, size_t offset, ClownLZSS_GraphEdge *node_meta_array, void *user),
	const size_t literal_cost,
	size_t (* const match_cost_callback)(size_t distance, size_t length, void *user),
	const unsigned char* const data,
	const size_t bytes_per_value,
	const size_t total_values,
	ClownLZSS_Match** const _matches,
	size_t* const _total_matches,
	const void* const user
)
{
	int success;

	success = 0;

	/* Handle the edge-case where the data is empty. */
	if (total_values == 0)
	{
		*_matches = NULL;
		*_total_matches = 0;
		success = 1;
	}
	else
	{
		const size_t node_meta_array_length = total_values + 1; /* +1 for the end-node */
		const size_t string_list_buffer_length = maximum_match_distance * 2 + 0x100;
		ClownLZSS_GraphEdge* const node_meta_array = (ClownLZSS_GraphEdge*)malloc(node_meta_array_length * sizeof(ClownLZSS_GraphEdge) + string_list_buffer_length * sizeof(size_t));

		if (node_meta_array != NULL)
		{
			size_t i;
			ClownLZSS_Match *matches;
			size_t total_matches;

			size_t* const prev = (size_t*)&node_meta_array[node_meta_array_length];
			size_t* const next = &prev[maximum_match_distance];
			const size_t DUMMY = -1;

			/* Initialise the string list heads */
			for (i = 0; i < 0x100; ++i)
				next[maximum_match_distance + i] = DUMMY;

			if (filler_value == -1)
			{
				/* Initialise the string list nodes */
				for (i = 0; i < maximum_match_distance; ++i)
					prev[i] = DUMMY;
			}
			else
			{
				next[maximum_match_distance + filler_value] = maximum_match_distance - 1;
				next[0] = DUMMY;
				prev[maximum_match_distance - 1] = maximum_match_distance + filler_value;

				/* Initialise the string list nodes */
				for (i = 0; i < maximum_match_distance - 1; ++i)
				{
					next[i + 1] = i;
					prev[i] = i + 1;
				}
			}

			/* Set costs to maximum possible value, so later comparisons work */
			node_meta_array[0].u.cost = 0;
			for (i = 1; i < total_values + 1; ++i)
				node_meta_array[i].u.cost = DUMMY;

			/* Search for matches, to populate the edges of the LZSS graph.
			   Notably, while doing this, we're also using a shortest-path
			   algorithm on the edges to find the best combination of matches
			   to produce the smallest file. */

			/* Advance through the data one step at a time */
			for (i = 0; i < total_values; ++i)
			{
				size_t match_string;

				const size_t string_list_head = maximum_match_distance + data[i * bytes_per_value];
				const size_t current_string = i % maximum_match_distance;

				if (extra_matches_callback != NULL)
					extra_matches_callback(data, total_values, i, node_meta_array, (void*)user);

				/* `string_list_head` points to a linked-list of strings in the LZSS sliding window that match at least
				   one byte with the current string: iterate over it and generate every possible match for this string */
				for (match_string = next[string_list_head]; match_string != DUMMY; match_string = next[match_string])
				{
					size_t j;

					const size_t distance = ((maximum_match_distance + i - match_string - 1) % maximum_match_distance) + 1;
					/* If `BYTES_PER_VALUE` is not 1, then we have to re-evaluate the first value, otherwise we can skip it */
					const unsigned int start = bytes_per_value == 1;
					const unsigned char *current_bytes = &data[(i + start) * bytes_per_value];
					const unsigned char *match_bytes = current_bytes - distance * bytes_per_value;

					for (j = start; j < CLOWNLZSS_MIN(maximum_match_length, total_values - i); ++j)
					{
						size_t l;

						if (match_bytes < data)
						{
							for (l = 0; l < bytes_per_value; ++l)
							{
								const unsigned char current_byte = *current_bytes;
								const unsigned char match_byte = (unsigned char)filler_value;

								++current_bytes;

								if (current_byte != match_byte)
									break;
							}

							match_bytes += bytes_per_value;
						}
						else
						{
							for (l = 0; l < bytes_per_value; ++l)
							{
								const unsigned char current_byte = *current_bytes;
								const unsigned char match_byte = *match_bytes;

								++current_bytes;
								++match_bytes;

								if (current_byte != match_byte)
									break;
							}
						}

						if (l != bytes_per_value)
						{
							/* No match: give up on the current run */
							break;
						}
						else
						{
							/* Figure out how much it costs to encode the current run */
							const size_t cost = match_cost_callback(distance, j + 1, (void*)user);

							/* Figure out if the cost is lower than that of any other runs that end at the same value as this one */
							if (cost != 0 && node_meta_array[i + j + 1].u.cost > node_meta_array[i].u.cost + cost)
							{
								/* Record this new best run in the graph edge assigned to the value at the end of the run */
								node_meta_array[i + j + 1].u.cost = node_meta_array[i].u.cost + cost;
								node_meta_array[i + j + 1].previous_node_index = i;
								node_meta_array[i + j + 1].match_offset = i - distance;
							}
						}
					}
				}

				/* If a literal match is more efficient than all runs assigned to this value, then use that instead */
				if (node_meta_array[i + 1].u.cost >= node_meta_array[i].u.cost + literal_cost)
				{
					node_meta_array[i + 1].u.cost = node_meta_array[i].u.cost + literal_cost;
					node_meta_array[i + 1].previous_node_index = i;
					node_meta_array[i + 1].match_offset = i + 1;
				}

				/* Replace the oldest string in the list with the new string, since it's about to be pushed out of the LZSS sliding window */

				/* Detach the old node in this slot */
				if (prev[current_string] != DUMMY)
					next[prev[current_string]] = DUMMY;

				/* Replace the old node with this new one, and insert it at the start of its matching list */
				prev[current_string] = string_list_head;
				next[current_string] = next[string_list_head];

				if (next[current_string] != DUMMY)
					prev[next[current_string]] = current_string;

				next[string_list_head] = current_string;
			}

			/* At this point, the edges will have formed a shortest-path from the start to the end:
			   You just have to start at the last edge, and follow it backwards all the way to the start. */

			/* Mark start/end nodes for the following loops */
			node_meta_array[0].previous_node_index = DUMMY;
			node_meta_array[total_values].u.next_node_index = DUMMY;

			/* Reverse the direction of the edges, so we can parse the LZSS graph from start to end */
			for (i = total_values; node_meta_array[i].previous_node_index != DUMMY; i = node_meta_array[i].previous_node_index)
				node_meta_array[node_meta_array[i].previous_node_index].u.next_node_index = i;

			/* Produce an array of LZSS matches for the caller to process. It's safe to overwrite the LZSS graph to do this. */
			matches = (ClownLZSS_Match*)node_meta_array;
			total_matches = 0;

			i = 0;
			while (node_meta_array[i].u.next_node_index != DUMMY)
			{
				const size_t next_index = node_meta_array[i].u.next_node_index;
				const size_t offset = node_meta_array[next_index].match_offset;

				matches[total_matches].source = offset;
				matches[total_matches].destination = i;
				matches[total_matches].length = next_index - i;

				++total_matches;

				i = next_index;
			}

			*_matches = matches;
			*_total_matches = total_matches;
			success = 1;
		}
	}

	return success;
}